

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

double __thiscall
ON_Interval::ClampedNormalizedParameterAt(ON_Interval *this,double interval_parameter)

{
  double interval_parameter_local;
  ON_Interval *this_local;
  
  if ((((interval_parameter <= -1.23432101234321e+308) ||
       (1.23432101234321e+308 <= interval_parameter)) || (this->m_t[0] <= -1.23432101234321e+308))
     || (((1.23432101234321e+308 < this->m_t[0] || this->m_t[0] == 1.23432101234321e+308 ||
          (this->m_t[1] <= -1.23432101234321e+308)) ||
         (1.23432101234321e+308 < this->m_t[1] || this->m_t[1] == 1.23432101234321e+308)))) {
    return ON_DBL_QNAN;
  }
  if (this->m_t[1] <= this->m_t[0]) {
    if (this->m_t[0] < this->m_t[1] || this->m_t[0] == this->m_t[1]) {
      if (interval_parameter < this->m_t[0]) {
        return 0.0;
      }
      if (this->m_t[1] <= interval_parameter && interval_parameter != this->m_t[1]) {
        return 1.0;
      }
      return 0.5;
    }
    if (this->m_t[0] <= interval_parameter) {
      return 0.0;
    }
    if (interval_parameter <= this->m_t[1]) {
      return 1.0;
    }
  }
  else {
    if (interval_parameter <= this->m_t[0]) {
      return 0.0;
    }
    if (this->m_t[1] <= interval_parameter) {
      return 1.0;
    }
  }
  return (interval_parameter - this->m_t[0]) / (this->m_t[1] - this->m_t[0]);
}

Assistant:

double ON_Interval::ClampedNormalizedParameterAt(
  double interval_parameter
) const
{
  if (ON_IS_VALID(interval_parameter) && ON_IS_VALID(m_t[0]) && ON_IS_VALID(m_t[1]))
  {
    if (m_t[0] < m_t[1])
    {
      // this is an increasing interval
      if (interval_parameter <= m_t[0])
        return 0.0;
      if (interval_parameter >= m_t[1])
        return 1.0;
    }
    else if (m_t[0] > m_t[1])
    {
      // this is a decreasing interval
      if (interval_parameter >= m_t[0])
        return 0.0;
      if (interval_parameter <= m_t[1])
        return 1.0;
    }
    else
    {
      // this is a singleton interval
      if (interval_parameter < m_t[0])
        return 0.0;
      if (interval_parameter > m_t[1])
        return 1.0;
      return 0.5;
    }

    // the interval_parameter is strictly between m_t[0] and m_t[1]
    return (interval_parameter - m_t[0]) / (m_t[1] - m_t[0]);
  }

  return ON_DBL_QNAN;
}